

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsChartElement.cpp
# Opt level: O1

void __thiscall KDReports::ChartElement::setChart(ChartElement *this,Chart *chart)

{
  return;
}

Assistant:

void KDReports::ChartElement::setChart(KDChart::Chart *chart)
{
#ifdef HAVE_KDCHART
    if (d->m_deleteChart)
        delete d->m_chart;
    d->m_chart = chart;
    d->m_deleteChart = false;
#else
    Q_UNUSED(chart);
#endif
}